

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode eyeballer_new(eyeballer **pballer,cf_ip_connect_create *cf_create,Curl_addrinfo *addr,
                      int ai_family,eyeballer *primary,timediff_t delay_ms,timediff_t timeout_ms,
                      expire_id timeout_id)

{
  CURLcode CVar1;
  eyeballer *peVar2;
  char *pcVar3;
  Curl_addrinfo *pCVar4;
  char *pcVar5;
  
  *pballer = (eyeballer *)0x0;
  peVar2 = (eyeballer *)(*Curl_ccalloc)(1,0x68);
  if (peVar2 == (eyeballer *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar5 = "ip";
    if (ai_family == 10) {
      pcVar5 = "ipv6";
    }
    pcVar3 = "ipv4";
    if (ai_family != 2) {
      pcVar3 = pcVar5;
    }
    peVar2->name = pcVar3;
    peVar2->cf_create = cf_create;
    peVar2->addr = addr;
    peVar2->first = addr;
    peVar2->ai_family = ai_family;
    peVar2->primary = primary;
    peVar2->delay_ms = delay_ms;
    pCVar4 = addr_next_match(addr,ai_family);
    peVar2->timeoutms = (ulong)timeout_ms >> (600 < timeout_ms && pCVar4 != (Curl_addrinfo *)0x0);
    peVar2->timeout_id = timeout_id;
    peVar2->result = CURLE_COULDNT_CONNECT;
    *pballer = peVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode eyeballer_new(struct eyeballer **pballer,
                              cf_ip_connect_create *cf_create,
                              const struct Curl_addrinfo *addr,
                              int ai_family,
                              struct eyeballer *primary,
                              timediff_t delay_ms,
                              timediff_t timeout_ms,
                              expire_id timeout_id)
{
  struct eyeballer *baller;

  *pballer = NULL;
  baller = calloc(1, sizeof(*baller));
  if(!baller)
    return CURLE_OUT_OF_MEMORY;

  baller->name = ((ai_family == AF_INET) ? "ipv4" : (
#ifdef USE_IPV6
                  (ai_family == AF_INET6) ? "ipv6" :
#endif
                  "ip"));
  baller->cf_create = cf_create;
  baller->first = baller->addr = addr;
  baller->ai_family = ai_family;
  baller->primary = primary;
  baller->delay_ms = delay_ms;
  baller->timeoutms = addr_next_match(baller->addr, baller->ai_family) ?
    USETIME(timeout_ms) : timeout_ms;
  baller->timeout_id = timeout_id;
  baller->result = CURLE_COULDNT_CONNECT;

  *pballer = baller;
  return CURLE_OK;
}